

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffdrec(fitsfile *fptr,int keypos,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  undefined1 auVar3 [16];
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  char *buffer;
  char *buffer_00;
  int iVar7;
  long bytepos;
  char buff2 [81];
  char buff1 [81];
  char local_e8 [96];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < keypos) {
    pFVar2 = fptr->Fptr;
    lVar6 = SUB168(SEXT816(pFVar2->headstart[pFVar2->curhdu]) * SEXT816(-0x6666666666666667),8);
    bytepos = pFVar2->headend;
    if ((long)(ulong)(uint)keypos <= ((lVar6 >> 5) - (lVar6 >> 0x3f)) + bytepos) {
      lVar6 = pFVar2->headstart[pFVar2->curhdu] + (ulong)(keypos * 0x50 - 0x50);
      pFVar2->nextkey = lVar6;
      auVar3 = SEXT816(bytepos - lVar6) * SEXT816(0x6666666666666667);
      iVar7 = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
      if (0 < iVar7) {
        builtin_strncpy(local_e8 + 0x20,"        ",9);
        builtin_strncpy(local_e8 + 0x10,"                ",0x10);
        builtin_strncpy(local_e8,"                ",0x10);
        sVar5 = strlen(local_e8);
        builtin_strncpy(local_e8 + sVar5,"                                        ",0x29);
        pcVar4 = local_88;
        buffer_00 = local_e8;
        do {
          buffer = pcVar4;
          bytepos = bytepos + -0x50;
          ffmbyt(fptr,bytepos,0,status);
          ffgbyt(fptr,0x50,buffer,status);
          ffmbyt(fptr,bytepos,0,status);
          ffpbyt(fptr,0x50,buffer_00,status);
          iVar7 = iVar7 + -1;
          pcVar4 = buffer_00;
          buffer_00 = buffer;
        } while (iVar7 != 0);
        pLVar1 = &fptr->Fptr->headend;
        *pLVar1 = *pLVar1 + -0x50;
        return *status;
      }
      snprintf(local_88,0x51,"Cannot delete keyword number %d.  It does not exist.",
               (ulong)(uint)keypos);
      ffpmsg(local_88);
    }
  }
  *status = 0xcb;
  return 0xcb;
}

Assistant:

int ffdrec(fitsfile *fptr,   /* I - FITS file pointer  */
           int keypos,       /* I - position in header of keyword to delete */
           int *status)      /* IO - error status      */
/*
  Delete a header keyword at position keypos. The 1st keyword is at keypos=1.
*/
{
    int ii, nshift;
    LONGLONG bytepos;
    char *inbuff, *outbuff, *tmpbuff, buff1[81], buff2[81];
    char message[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (keypos < 1 ||
        keypos > (fptr->Fptr)->headend - (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] / 80 )
        return(*status = KEY_OUT_BOUNDS);

    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] + (keypos - 1) * 80;

    nshift=(int) (( (fptr->Fptr)->headend - (fptr->Fptr)->nextkey ) / 80); /* no. keywords to shift */

    if (nshift <= 0)
    {
        snprintf(message, FLEN_ERRMSG,"Cannot delete keyword number %d.  It does not exist.",
                keypos);
        ffpmsg(message);
        return(*status = KEY_OUT_BOUNDS);
    }

    bytepos = (fptr->Fptr)->headend - 80;  /* last keyword in header */  

    /* construct a blank keyword */
    strcpy(buff2, "                                        ");
    strcat(buff2, "                                        ");
    inbuff  = buff1;
    outbuff = buff2;
    for (ii = 0; ii < nshift; ii++) /* shift each keyword up one position */
    {

        ffmbyt(fptr, bytepos, REPORT_EOF, status);
        ffgbyt(fptr, 80, inbuff, status);   /* read the current keyword */

        ffmbyt(fptr, bytepos, REPORT_EOF, status);
        ffpbyt(fptr, 80, outbuff, status);  /* overwrite with next keyword */

        tmpbuff = inbuff;   /* swap input and output buffers */
        inbuff = outbuff;
        outbuff = tmpbuff;

        bytepos -= 80;
    }

    (fptr->Fptr)->headend -= 80; /* decrement the position of the END keyword */
    return(*status);
}